

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::operator*(APInt *this,APInt *RHS)

{
  WordType *dst;
  WordType *lhs;
  WordType *rhs;
  bool bVar1;
  uint uVar2;
  uint64_t *val;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  APInt AVar4;
  APInt *RHS_local;
  APInt *this_local;
  APInt *Result;
  
  if (RHS->BitWidth != *(uint *)(in_RDX + 1)) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0xe6,"APInt llvm::APInt::operator*(const APInt &) const");
  }
  bVar1 = isSingleWord(RHS);
  if (bVar1) {
    APInt(this,RHS->BitWidth,(RHS->U).VAL * *in_RDX,false);
    uVar3 = extraout_RDX;
  }
  else {
    uVar2 = getNumWords(RHS);
    val = getMemory(uVar2);
    uVar2 = getBitWidth(RHS);
    APInt(this,val,uVar2);
    dst = (this->U).pVal;
    lhs = (RHS->U).pVal;
    rhs = (WordType *)*in_RDX;
    uVar2 = getNumWords(RHS);
    tcMultiply(dst,lhs,rhs,uVar2);
    clearUnusedBits(this);
    uVar3 = extraout_RDX_00;
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::operator*(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    return APInt(BitWidth, U.VAL * RHS.U.VAL);

  APInt Result(getMemory(getNumWords()), getBitWidth());

  tcMultiply(Result.U.pVal, U.pVal, RHS.U.pVal, getNumWords());

  Result.clearUnusedBits();
  return Result;
}